

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_xfrm.c
# Opt level: O3

void easm_substpos_insn(easm_insn *insn,uint64_t val)

{
  easm_subinsn *peVar1;
  long lVar2;
  long lVar3;
  
  if (0 < insn->subinsnsnum) {
    lVar3 = 0;
    do {
      peVar1 = insn->subinsns[lVar3];
      if (0 < peVar1->prefsnum) {
        lVar2 = 0;
        do {
          easm_substpos_expr(peVar1->prefs[lVar2],val);
          lVar2 = lVar2 + 1;
          peVar1 = insn->subinsns[lVar3];
        } while (lVar2 < peVar1->prefsnum);
      }
      easm_substpos_sinsn(peVar1->sinsn,val);
      lVar3 = lVar3 + 1;
    } while (lVar3 < insn->subinsnsnum);
  }
  return;
}

Assistant:

void easm_substpos_insn(struct easm_insn *insn, uint64_t val) {
	int i, j;
	for (i = 0; i < insn->subinsnsnum; i++) {
		for (j = 0; j < insn->subinsns[i]->prefsnum; j++)
			easm_substpos_expr(insn->subinsns[i]->prefs[j], val);
		easm_substpos_sinsn(insn->subinsns[i]->sinsn, val);
	}
}